

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolic_invert.cc
# Opt level: O3

void ipx::SymbolicInvert(Model *model,vector<int,_std::allocator<int>_> *basis,Int *rowcounts,
                        Int *colcounts)

{
  uint uVar1;
  int iVar2;
  Int *pIVar3;
  Int *pIVar4;
  int *piVar5;
  void *pvVar6;
  pointer piVar7;
  Int *Ai;
  pointer pdVar8;
  pointer piVar9;
  pointer pdVar10;
  result_type_conflict2 rVar11;
  uint uVar12;
  Int IVar13;
  int *piVar14;
  int iVar15;
  ulong uVar16;
  pointer piVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  size_type sVar21;
  vector<int,_std::allocator<int>_> stack;
  allocator_type local_249;
  vector<int,_std::allocator<int>_> marked;
  vector<int,_std::allocator<int>_> work;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  blocks;
  vector<int,_std::allocator<int>_> marked_1;
  Int *local_1d8;
  pointer local_1c0;
  pointer local_1a8;
  pointer local_190;
  value_type_conflict2 local_16c;
  vector<int,_std::allocator<int>_> work_1;
  Int *local_148;
  pointer local_130;
  pointer local_118;
  pointer local_100;
  vector<int,_std::allocator<int>_> jmatch;
  default_random_engine re;
  pointer local_b8;
  pointer local_a0;
  pointer local_88;
  pointer local_70;
  pointer local_58;
  
  pdVar10 = local_190;
  piVar9 = local_1a8;
  pdVar8 = local_1c0;
  Ai = local_1d8;
  uVar1 = (model->AI_).nrow_;
  re._M_x = 1;
  uVar12 = (uint)((ulong)((long)(basis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(basis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
  marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = uVar12 - 1;
  marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector(&work,basis);
  if (0 < (int)uVar12) {
    uVar16 = 0;
    do {
      piVar7 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      rVar11 = std::uniform_int_distribution<int>::operator()
                         ((uniform_int_distribution<int> *)&marked_1,&re,(param_type *)&marked_1);
      iVar15 = piVar7[uVar16];
      piVar7[uVar16] =
           work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[rVar11];
      work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [rVar11] = iVar15;
      uVar16 = uVar16 + 1;
    } while ((uVar12 & 0x7fffffff) != uVar16);
  }
  iVar15 = model->num_rows_;
  sVar21 = (size_type)iVar15;
  iVar2 = model->num_cols_;
  pIVar3 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar4 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  re._M_x._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&jmatch,sVar21,(value_type_conflict2 *)&re,(allocator_type *)&marked_1);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&re,pIVar3,pIVar3 + (long)iVar2 + sVar21,
             (allocator_type *)&marked_1);
  work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&marked_1,(long)iVar2 + sVar21,(value_type_conflict2 *)&work_1,(allocator_type *)&stack
            );
  std::vector<int,_std::allocator<int>_>::vector(&work_1,sVar21,(allocator_type *)&stack);
  sVar21 = (size_type)(iVar15 + 1);
  std::vector<int,_std::allocator<int>_>::vector(&stack,sVar21,(allocator_type *)&marked);
  std::vector<int,_std::allocator<int>_>::vector(&marked,sVar21,(allocator_type *)&blocks);
  piVar7 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar17 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish)
  {
    do {
      iVar15 = *piVar17;
      if (pIVar3[(long)iVar15 + 1] == pIVar3[iVar15] + 1) {
        AugmentingPath(iVar15,pIVar3,pIVar4,
                       jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,(Int *)re._M_x,
                       (Int *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       marked_1.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_),
                       (Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._4_4_,
                                       work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._0_4_),
                       (Int *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._4_4_,
                                       stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._0_4_),
                       (Int *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._4_4_,
                                       marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._0_4_));
      }
      piVar17 = piVar17 + 1;
      piVar14 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
    } while (piVar17 != piVar7);
    for (; piVar14 !=
           work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish; piVar14 = piVar14 + 1) {
      iVar15 = *piVar14;
      if (pIVar3[(long)iVar15 + 1] != pIVar3[iVar15] + 1) {
        AugmentingPath(iVar15,pIVar3,pIVar4,
                       jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,(Int *)re._M_x,
                       (Int *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       marked_1.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_),
                       (Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._4_4_,
                                       work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._0_4_),
                       (Int *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._4_4_,
                                       stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._0_4_),
                       (Int *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._4_4_,
                                       marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._0_4_));
      }
    }
  }
  if ((void *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if (re._M_x != 0) {
    operator_delete((void *)re._M_x);
  }
  if (work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  CopyColumns((SparseMatrix *)&re,&model->AI_,&jmatch);
  Transpose((SparseMatrix *)&marked_1,(SparseMatrix *)&re);
  piVar7 = marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  re._M_x._0_4_ =
       marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_b8 != (pointer)0x0) {
    operator_delete(local_b8);
  }
  local_1d8 = (Int *)0x0;
  if (local_a0 != (pointer)0x0) {
    operator_delete(local_a0);
  }
  local_1c0 = (pointer)0x0;
  if (local_88 != (pointer)0x0) {
    operator_delete(local_88);
  }
  local_1a8 = (pointer)0x0;
  if (local_70 != (pointer)0x0) {
    operator_delete(local_70);
  }
  local_190 = (pointer)0x0;
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58);
  }
  if (marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    operator_delete(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  uVar12 = (model->AI_).nrow_;
  uVar16 = (ulong)uVar12;
  pIVar3 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar4 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar21 = (size_type)(int)uVar12;
  std::vector<int,_std::allocator<int>_>::vector(&marked_1,sVar21,(allocator_type *)&work_1);
  std::vector<int,_std::allocator<int>_>::vector(&work_1,sVar21,(allocator_type *)&stack);
  std::vector<int,_std::allocator<int>_>::vector(&stack,sVar21,(allocator_type *)&marked);
  if (0 < (int)uVar12) {
    uVar19 = 0;
    do {
      if (((Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_))[uVar19] != 1) {
        uVar12 = DepthFirstSearch((Int)uVar19,pIVar3,pIVar4,
                                  jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,uVar12,
                                  (Int *)CONCAT44(marked_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  marked_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                  (Int *)CONCAT44(work_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  work_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),1,
                                  (Int *)CONCAT44(stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      uVar19 = uVar19 + 1;
    } while (uVar16 != uVar19);
  }
  blocks.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blocks.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blocks.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&marked,sVar21,(allocator_type *)&work);
  piVar17 = marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  piVar14 = (int *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (piVar14 !=
      marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      if (((Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_))[*piVar14] != 2) {
        uVar12 = DepthFirstSearch(*piVar14,piVar7,Ai,(Int *)0x0,(int)uVar16,
                                  (Int *)CONCAT44(marked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  marked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                  (Int *)CONCAT44(work_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  work_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),2,
                                  (Int *)CONCAT44(stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_));
        std::vector<int,std::allocator<int>>::
        vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)&work,
                   (int *)(CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_) + (long)(int)uVar12 * 4)
                   ,(int *)(CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_) + (long)(int)uVar16 * 4
                           ),(allocator_type *)&local_16c);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&blocks,&work);
        if (work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar16 = (ulong)uVar12;
      }
      piVar14 = piVar14 + 1;
    } while (piVar14 != piVar17);
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
            (blocks.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             blocks.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((void *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  sVar21 = (size_type)(int)re._M_x;
  lVar18 = (long)blocks.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)blocks.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_
       = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&work_1,sVar21,(value_type_conflict2 *)&stack,(allocator_type *)&marked);
  uVar12 = (int)(lVar18 >> 3) * -0x55555555;
  if (0 < (int)uVar12) {
    uVar16 = 0;
    do {
      piVar5 = blocks.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar14 = blocks.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start; piVar14 != piVar5; piVar14 = piVar14 + 1) {
        *(int *)(CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + (long)*piVar14 * 4) =
             (int)uVar16;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uVar12 & 0x7fffffff));
  }
  SparseMatrix::SparseMatrix((SparseMatrix *)&marked_1,uVar12,0);
  marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&stack,sVar21,(value_type_conflict2 *)&marked,(allocator_type *)&work);
  if (0 < (int)uVar12) {
    uVar16 = 0;
    do {
      piVar5 = blocks.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar14 = blocks.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start; piVar14 != piVar5; piVar14 = piVar14 + 1) {
        lVar20 = (long)*piVar14;
        lVar18 = (long)piVar7[lVar20];
        if (piVar7[lVar20] < piVar7[lVar20 + 1]) {
          do {
            iVar15 = *(int *)(CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._4_4_,
                                       work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._0_4_) +
                             (long)Ai[lVar18] * 4);
            if (uVar16 != *(uint *)(CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             stack.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                   (long)iVar15 * 4)) {
              *(int *)(CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + (long)iVar15 * 4) =
                   (int)uVar16;
              SparseMatrix::push_back((SparseMatrix *)&marked_1,iVar15,1.0);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < piVar7[lVar20 + 1]);
        }
      }
      SparseMatrix::add_column((SparseMatrix *)&marked_1);
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uVar12 & 0x7fffffff));
  }
  if ((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  uVar12 = (int)((long)blocks.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)blocks.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  sVar21 = (size_type)(int)uVar12;
  std::vector<int,_std::allocator<int>_>::vector(&stack,sVar21,(allocator_type *)&work_1);
  std::vector<int,_std::allocator<int>_>::vector(&marked,sVar21,(allocator_type *)&work_1);
  std::vector<int,_std::allocator<int>_>::vector(&work,sVar21,(allocator_type *)&work_1);
  if (rowcounts != (Int *)0x0) {
    local_16c = -1;
    std::vector<int,_std::allocator<int>_>::vector
              (&work_1,((long)(model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000
                       >> 0x20,&local_16c,&local_249);
    piVar17 = (pointer)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
    if (piVar17 !=
        marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      memset(piVar17,0xff,
             ((long)marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + (-4 - (long)piVar17) & 0xfffffffffffffffcU)
             + 4);
    }
    piVar17 = marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
    if (0 < (int)uVar12) {
      uVar16 = 0;
      do {
        IVar13 = DepthFirstSearch((Int)uVar16,piVar17,(Int *)0x0,(Int *)0x0,uVar12,
                                  (Int *)CONCAT44(stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                  (Int *)CONCAT44(marked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  marked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                  (Int)uVar16,
                                  work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
        iVar15 = 0;
        if (IVar13 < (int)uVar12) {
          uVar19 = (ulong)IVar13;
          iVar15 = 0;
          do {
            iVar2 = *(int *)(CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._4_4_,
                                      stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._0_4_) + uVar19 * 4);
            iVar15 = iVar15 + (int)((ulong)((long)blocks.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)blocks.
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
            uVar19 = uVar19 + 1;
          } while ((uVar12 & 0x7fffffff) != uVar19);
        }
        piVar14 = blocks.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        piVar5 = blocks.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        if (piVar14 != piVar5) {
          do {
            *(int *)(CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) +
                    (long)jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[*piVar14] * 4) = iVar15;
            piVar14 = piVar14 + 1;
          } while (piVar14 != piVar5);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != (uVar12 & 0x7fffffff));
    }
    pvVar6 = (void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if ((int)uVar1 < 1) {
      if (pvVar6 == (void *)0x0) goto LAB_003b07e7;
    }
    else {
      piVar17 = (basis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar16 = 0;
      do {
        rowcounts[uVar16] = *(Int *)((long)pvVar6 + (long)piVar17[uVar16] * 4);
        uVar16 = uVar16 + 1;
      } while (uVar1 != uVar16);
    }
    operator_delete(pvVar6);
  }
LAB_003b07e7:
  if (colcounts != (Int *)0x0) {
    Transpose((SparseMatrix *)&work_1,(SparseMatrix *)&marked_1);
    piVar17 = marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
    marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_;
    marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
    marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (piVar17 != (pointer)0x0) {
      operator_delete(piVar17);
    }
    local_1d8 = local_148;
    local_1c0 = local_130;
    local_1a8 = local_118;
    local_190 = local_100;
    if (work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) {
      operator_delete(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    }
    piVar17 = (pointer)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
    if (piVar17 !=
        marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      memset(piVar17,0xff,
             ((long)marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + (-4 - (long)piVar17) & 0xfffffffffffffffcU)
             + 4);
    }
    piVar17 = marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
    if (0 < (int)uVar12) {
      uVar16 = 0;
      do {
        IVar13 = DepthFirstSearch((Int)uVar16,piVar17,local_148,(Int *)0x0,uVar12,
                                  (Int *)CONCAT44(stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                  (Int *)CONCAT44(marked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  marked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                  (Int)uVar16,
                                  work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
        iVar15 = 0;
        if (IVar13 < (int)uVar12) {
          uVar19 = (ulong)IVar13;
          iVar15 = 0;
          do {
            iVar2 = *(int *)(CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._4_4_,
                                      stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._0_4_) + uVar19 * 4);
            iVar15 = iVar15 + (int)((ulong)((long)blocks.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)blocks.
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
            uVar19 = uVar19 + 1;
          } while ((uVar12 & 0x7fffffff) != uVar19);
        }
        piVar5 = blocks.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        for (piVar14 = blocks.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start; piVar14 != piVar5; piVar14 = piVar14 + 1) {
          colcounts[*piVar14] = iVar15;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != (uVar12 & 0x7fffffff));
    }
  }
  if (work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if (local_190 != (pointer)0x0) {
    operator_delete(local_190);
  }
  if (local_1a8 != (pointer)0x0) {
    operator_delete(local_1a8);
  }
  if (local_1c0 != (pointer)0x0) {
    operator_delete(local_1c0);
  }
  if (local_1d8 != (Int *)0x0) {
    operator_delete(local_1d8);
  }
  if (marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    operator_delete(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&blocks);
  if (pdVar10 != (pointer)0x0) {
    operator_delete(pdVar10);
  }
  if (piVar9 != (pointer)0x0) {
    operator_delete(piVar9);
  }
  if (pdVar8 != (pointer)0x0) {
    operator_delete(pdVar8);
  }
  if (Ai != (Int *)0x0) {
    operator_delete(Ai);
  }
  if (piVar7 != (pointer)0x0) {
    operator_delete(piVar7);
  }
  if (jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SymbolicInvert(const Model& model, const std::vector<Int>& basis,
                    Int* rowcounts, Int* colcounts) {
    const SparseMatrix& AI = model.AI();
    const Int m = AI.rows();
    assert((Int)basis.size() == m);

    // jmatch is a permutation of basis such that B = AI[:,jmatch] has a
    // zero-free diagonal.
    std::vector<Int> jmatch = Matching(model, RandomPermute(basis));
    SparseMatrix BT = CopyColumns(AI, jmatch);
    BT = Transpose(BT);

    std::vector<std::vector<Int> > blocks = Blockperm(AI, jmatch, BT);
    SparseMatrix C = CoarsenedGraph(BT, blocks);

    const Int nb = blocks.size();
    std::vector<Int> stack(nb), marked(nb), work(nb);

    if (rowcounts) {
        std::vector<Int> jcount(AI.cols(), -1);
        std::fill(marked.begin(), marked.end(), -1);
        const Int* Cp = C.colptr();
        const Int* Ci = C.rowidx();
        for (Int b = 0; b < nb; b++) {
            Int top = DepthFirstSearch(b, Cp, Ci, nullptr, nb, stack.data(),
                                       marked.data(), b, work.data());
            Int nz = 0;
            for (Int t = top; t < nb; t++)
                nz += blocks[stack[t]].size();
            for (Int i : blocks[b])
                jcount[jmatch[i]] = nz;
        }
        for (Int p = 0; p < m; p++) {
            rowcounts[p] = jcount[basis[p]];
            assert(rowcounts[p] >= 0);
        }
    }

    if (colcounts) {
        C = Transpose(C);
        std::fill(marked.begin(), marked.end(), -1);
        const Int* Cp = C.colptr();
        const Int* Ci = C.rowidx();
        for (Int b = 0; b < nb; b++) {
            Int top = DepthFirstSearch(b, Cp, Ci, nullptr, nb, stack.data(),
                                       marked.data(), b, work.data());
            Int nz = 0;
            for (Int t = top; t < nb; t++)
                nz += blocks[stack[t]].size();
            for (Int i : blocks[b])
                colcounts[i] = nz;
        }
    }
}